

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O3

float64 vector_dist_eucl(float32 *v1,float32 *v2,int32 len)

{
  ulong uVar1;
  double dVar2;
  
  if (0 < len) {
    dVar2 = 0.0;
    uVar1 = 0;
    do {
      dVar2 = dVar2 + (double)(((float)v1[uVar1] - (float)v2[uVar1]) *
                              ((float)v1[uVar1] - (float)v2[uVar1]));
      uVar1 = uVar1 + 1;
    } while ((uint)len != uVar1);
    return (float64)dVar2;
  }
  return 0.0;
}

Assistant:

float64
vector_dist_eucl(float32 * v1, float32 * v2, int32 len)
{
    float64 d;
    int32 i;

    d = 0.0;
    for (i = 0; i < len; i++)
        d += (v1[i] - v2[i]) * (v1[i] - v2[i]);

    return d;
}